

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  long lVar1;
  Type *proto_00;
  EnumOptions *pEVar2;
  EnumOptions *pEVar3;
  int i;
  long lVar4;
  long lVar5;
  
  EnumDescriptorProto::set_name(proto,*(string **)this);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(this + 0x2c); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(this + 0x30);
    proto_00 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                         (&(proto->value_).super_RepeatedPtrFieldBase);
    EnumValueDescriptor::CopyTo((EnumValueDescriptor *)(lVar1 + lVar5),proto_00);
    lVar5 = lVar5 + 0x28;
  }
  pEVar3 = *(EnumOptions **)(this + 0x20);
  pEVar2 = EnumOptions::default_instance();
  if (pEVar3 != pEVar2) {
    pEVar3 = EnumDescriptorProto::mutable_options(proto);
    EnumOptions::CopyFrom(pEVar3,*(EnumOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}